

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void auto_commit_space_used_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle **ppfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  long lVar10;
  fdb_doc **ppfVar11;
  fdb_doc *pfVar12;
  char *ptr_handle;
  fdb_config *pfVar13;
  fdb_doc *__s;
  char *pcVar14;
  fdb_file_handle **ptr_fhandle;
  uint uVar15;
  ulong uVar16;
  fdb_doc **doc_00;
  fdb_kvs_handle **ppfVar17;
  char *handle;
  bool bVar18;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  char fname [32];
  timeval __test_begin;
  fdb_file_info finfo;
  fdb_kvs_handle *pfStack_1b768;
  fdb_file_handle *pfStack_1b760;
  void *pvStack_1b758;
  size_t asStack_1b750 [3];
  undefined4 uStack_1b738;
  undefined4 uStack_1b734;
  undefined4 uStack_1b730;
  undefined4 uStack_1b72c;
  undefined4 uStack_1b728;
  fdb_kvs_config fStack_1b720;
  timeval tStack_1b708;
  fdb_config fStack_1b6f8;
  char acStack_1b600 [256];
  char acStack_1b500 [256];
  char acStack_1b400 [264];
  fdb_config *pfStack_1b2f8;
  fdb_kvs_handle **ppfStack_1b2f0;
  fdb_kvs_handle *pfStack_1b2e8;
  fdb_kvs_handle **ppfStack_1b2e0;
  fdb_kvs_handle *pfStack_1b2d8;
  code *pcStack_1b2d0;
  fdb_kvs_handle *pfStack_1b2b8;
  fdb_file_handle *pfStack_1b2b0;
  fdb_kvs_handle *pfStack_1b2a8;
  fdb_kvs_handle *pfStack_1b2a0;
  fdb_kvs_config fStack_1b298;
  timeval tStack_1b280;
  fdb_config fStack_1b270;
  fdb_kvs_handle *apfStack_1b178 [32];
  fdb_config fStack_1b078;
  fdb_kvs_handle **ppfStack_1af70;
  fdb_kvs_handle **ppfStack_1af68;
  fdb_kvs_handle **ppfStack_1af60;
  fdb_kvs_handle *pfStack_1af58;
  fdb_kvs_handle *pfStack_1af48;
  fdb_kvs_handle *pfStack_1af40;
  fdb_kvs_handle **ppfStack_1af38;
  fdb_kvs_handle *pfStack_1af30;
  fdb_kvs_config fStack_1af28;
  undefined1 auStack_1af10 [128];
  fdb_kvs_handle *apfStack_1ae90 [33];
  fdb_config fStack_1ad88;
  fdb_kvs_handle *apfStack_1ac90 [32];
  fdb_kvs_handle *apfStack_1ab90 [32];
  fdb_kvs_handle fStack_1aa90;
  undefined8 auStack_1a690 [896];
  fdb_kvs_handle *apfStack_18a90 [1025];
  fdb_doc **ppfStack_16a88;
  char *pcStack_16a80;
  long lStack_16a78;
  fdb_doc *pfStack_16a70;
  fdb_doc **ppfStack_16a68;
  fdb_doc *pfStack_16a60;
  fdb_doc *pfStack_16a48;
  fdb_file_handle *pfStack_16a40;
  long lStack_16a38;
  fdb_kvs_handle *pfStack_16a30;
  long lStack_16a28;
  long lStack_16a20;
  fdb_doc **ppfStack_16a18;
  long lStack_16a10;
  fdb_doc **ppfStack_16a08;
  size_t sStack_16a00;
  timeval tStack_169f8;
  fdb_kvs_config fStack_169e8;
  fdb_file_info fStack_169d0;
  fdb_doc afStack_16988 [3];
  char acStack_16888 [264];
  fdb_config fStack_16780;
  char acStack_16688 [256];
  fdb_doc *apfStack_16588 [2999];
  size_t sStack_107d0;
  size_t asStack_107c8 [1023];
  undefined1 auStack_e7c9 [57225];
  fdb_doc **ppfStack_840;
  fdb_config *pfStack_838;
  fdb_file_handle **ppfStack_830;
  ulong uStack_828;
  fdb_kvs_handle **ppfStack_820;
  fdb_kvs_handle **ppfStack_818;
  fdb_doc *pfStack_800;
  fdb_kvs_handle *pfStack_7f8;
  undefined1 auStack_7f0 [24];
  fdb_file_handle *pfStack_7d8;
  fdb_kvs_handle *pfStack_7d0;
  fdb_kvs_config fStack_7c8;
  fdb_doc *apfStack_7b0 [31];
  timeval tStack_6b8;
  fdb_config fStack_6a8;
  char acStack_5b0 [256];
  fdb_file_handle *apfStack_4b0 [32];
  char acStack_3b0 [264];
  fdb_kvs_handle **ppfStack_2a8;
  char *pcStack_2a0;
  char *pcStack_298;
  ulong uStack_290;
  undefined8 uStack_288;
  code *pcStack_280;
  fdb_file_handle *local_278;
  fdb_kvs_handle *local_270;
  char local_268 [32];
  fdb_kvs_config local_248;
  timeval local_230;
  fdb_file_info local_220 [3];
  fdb_config local_128;
  
  pcStack_280 = (code *)0x1181bd;
  gettimeofday(&local_230,(__timezone_ptr_t)0x0);
  pcStack_280 = (code *)0x1181c2;
  memleak_start();
  pcStack_280 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_280 = (code *)0x1181de;
  fdb_get_default_config();
  local_128.buffercache_size = 0;
  local_128.auto_commit = true;
  pcStack_280 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_280 = (code *)0x118207;
  memcpy(&local_128,local_220,0xf8);
  pcStack_280 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar16 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(local_268 + 8,"est1",5);
    builtin_strncpy(local_268,"./func_t",8);
    pcStack_280 = (code *)0x11825c;
    fVar3 = fdb_open(&local_278,local_268,&local_128);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_280 = (code *)0x118278;
    fVar3 = fdb_kvs_open(local_278,&local_270,"justonekv",&local_248);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_280 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_280 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(local_278,local_220);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (local_220[0].file_size != local_128.blocksize * 7) {
      pcStack_280 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_280 = (code *)0x1182b9;
    fVar3 = fdb_close(local_278);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar15 = (int)uVar16 + 1;
    uVar16 = (ulong)uVar15;
    if (uVar15 == 0) {
      pcStack_280 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_280 = (code *)0x1182e9;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_280 = (code *)0x11831a;
      fprintf(_stderr,pcVar14,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_280 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_280 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_280 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_288 = 0x745f636e75662f2e;
  pcStack_298 = "justonekv";
  ppfStack_818 = (fdb_kvs_handle **)0x118363;
  ppfStack_2a8 = &local_270;
  pcStack_2a0 = local_268;
  uStack_290 = uVar16;
  pcStack_280 = (code *)&local_278;
  gettimeofday(&tStack_6b8,(__timezone_ptr_t)0x0);
  ppfStack_818 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_800 = (fdb_doc *)0x0;
  ppfStack_818 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_818 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_818 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_6a8.buffercache_size = 0;
  fStack_6a8.flags = 1;
  fStack_6a8.purging_interval = 0;
  fStack_6a8.compaction_threshold = '\0';
  ppfStack_818 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),&fStack_7c8);
  ppfVar11 = apfStack_7b0;
  uVar16 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_5b0,"key%d",uVar16 & 0xffffffff);
    ppfStack_818 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_3b0,"meta%d",uVar16 & 0xffffffff);
    ptr_fhandle = apfStack_4b0;
    ppfStack_818 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar16 & 0xffffffff);
    ppfStack_818 = (fdb_kvs_handle **)0x118462;
    ppfVar5 = (fdb_kvs_handle **)strlen(acStack_5b0);
    ppfStack_818 = (fdb_kvs_handle **)0x11846d;
    sVar6 = strlen(acStack_3b0);
    ppfStack_818 = (fdb_kvs_handle **)0x118478;
    sVar7 = strlen((char *)ptr_fhandle);
    ppfStack_818 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar11,acStack_5b0,(size_t)ppfVar5,acStack_3b0,sVar6,ptr_fhandle,sVar7);
    uVar16 = uVar16 + 1;
    ppfVar11 = ppfVar11 + 1;
  } while (uVar16 != 0x1e);
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_7f8,apfStack_7b0[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  ppfStack_818 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ppfVar17 = (fdb_kvs_handle **)0x1551a5;
  pfVar13 = &fStack_6a8;
  ppfStack_818 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",pfVar13);
  ppfStack_818 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",pfVar13);
  ppfStack_818 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),&fStack_7c8);
  uVar16 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar16]->key,apfStack_7b0[uVar16]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if (uVar16 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_818 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 4);
  ppfStack_818 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_7f8,apfStack_7b0[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ppfVar17 = (fdb_kvs_handle **)0x1551a5;
  pfVar13 = &fStack_6a8;
  ppfStack_818 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",pfVar13);
  ppfStack_818 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",pfVar13);
  ppfStack_818 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),&fStack_7c8);
  uVar16 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar16]->key,apfStack_7b0[uVar16]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if ((uVar16 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_818 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_818 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 6);
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_7f8,apfStack_7b0[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[lVar10 + 6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_7d8,"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_7d8,&pfStack_7d0,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_7d8,'\x02');
  lVar10 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_7d0,apfStack_7b0[lVar10 + 8]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_818 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_7d8,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_7d8);
  ppfStack_818 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,&pfStack_7f8,&fStack_7c8);
  uVar16 = 0;
  do {
    ppfStack_818 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar16]->key,apfStack_7b0[uVar16]->keylen,(void *)0x0,0
                   ,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if ((int)uVar16 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_818 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
  } while (uVar16 != 10);
  pfVar13 = (fdb_config *)auStack_7f0;
  ppfStack_818 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar13,"dummy1",&fStack_6a8);
  ptr_fhandle = &pfStack_7d8;
  ppfStack_818 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&fStack_6a8);
  ppfVar17 = (fdb_kvs_handle **)(auStack_7f0 + 8);
  ppfStack_818 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._0_8_,ppfVar17,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_7d8,&pfStack_7d0,&fStack_7c8);
  ppfStack_818 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
  ppfVar5 = &pfStack_7f8;
  ppfStack_818 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_7f8,apfStack_7b0[10]);
  ppfStack_818 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_7f8,apfStack_7b0[0xb]);
  ppfStack_818 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[0xc]);
  ppfStack_818 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[0xd]);
  ppfStack_818 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_7d8,'\x02');
  ppfStack_818 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_7d0,apfStack_7b0[0xe]);
  ppfStack_818 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_7d0,apfStack_7b0[0xf]);
  ppfStack_818 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_7f8,apfStack_7b0[0x10]);
  ppfStack_818 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_7d8,'\x01');
  ppfStack_818 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_7f8,apfStack_7b0[0x11]);
  uVar16 = 0;
  ppfStack_818 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_7f0._16_8_,'\0');
  ppfStack_818 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
  ppfStack_818 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_7d8);
  ppfStack_818 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_7f0 + 0x10),"dummy1",&fStack_6a8);
  ppfStack_818 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_7f0._16_8_,ppfVar5,&fStack_7c8);
  while( true ) {
    ppfStack_818 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_800,apfStack_7b0[uVar16 + 10]->key,apfStack_7b0[uVar16 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_818 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_7f8,pfStack_800);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_818 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_800);
    pfStack_800 = (fdb_doc *)0x0;
    uVar16 = uVar16 + 1;
    if (uVar16 == 8) {
      ppfStack_818 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_7f0,"dummy1",&fStack_6a8);
      ppfStack_818 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_7f0._0_8_,(fdb_kvs_handle **)(auStack_7f0 + 8),
                 &fStack_7c8);
      ppfStack_818 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x02');
      ppfStack_818 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_7f0._8_8_,apfStack_7b0[0x14]);
      ppfStack_818 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_7f0._16_8_,"dummy2");
      ppfStack_818 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_7f0._0_8_,'\x01');
      ppfStack_818 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_7f0._16_8_);
      ppfStack_818 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_7f0._0_8_);
      lVar10 = 0;
      do {
        ppfStack_818 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_7b0[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1e);
      ppfStack_818 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_818 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      ppfStack_818 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar14,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_818 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_818 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_818 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_818 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_818 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_16a60 = (fdb_doc *)0x118b77;
  ppfStack_840 = &pfStack_800;
  pfStack_838 = pfVar13;
  ppfStack_830 = ptr_fhandle;
  uStack_828 = uVar16;
  ppfStack_820 = ppfVar17;
  ppfStack_818 = ppfVar5;
  gettimeofday(&tStack_169f8,(__timezone_ptr_t)0x0);
  pfStack_16a60 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_16a48 = (fdb_doc *)0x0;
  pfStack_16a60 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_16a60 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_16a60 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_16780.flags = 1;
  fStack_16780.purging_interval = 0;
  fStack_16780.compaction_threshold = '\0';
  fStack_16780.durability_opt = '\x02';
  pfStack_16a60 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_16a40,"dummy1",&fStack_16780);
  pfStack_16a60 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_16a40,&pfStack_16a30,&fStack_169e8);
  ppfVar11 = apfStack_16588;
  __s = afStack_16988;
  pfVar12 = (fdb_doc *)0x0;
  lVar10 = 0;
  do {
    sVar6 = 0xff7f;
    if (lVar10 == 1) {
      sVar6 = 0x1fff;
    }
    if (lVar10 == 0) {
      sVar6 = 0x7fff;
    }
    pfStack_16a60 = (fdb_doc *)0x118c39;
    lStack_16a28 = lVar10;
    memset(asStack_107c8,0x5f,sVar6);
    *(undefined1 *)((long)asStack_107c8 + sVar6) = 0;
    lVar10 = 0;
    doc_00 = ppfVar11;
    lStack_16a20 = (long)pfVar12;
    ppfStack_16a18 = ppfVar11;
    sStack_16a00 = sVar6;
    do {
      pfStack_16a60 = (fdb_doc *)0x118c6f;
      lStack_16a10 = lVar10;
      sprintf((char *)__s,"%08d");
      asStack_107c8[0] = afStack_16988[0].keylen;
      uVar16 = 0;
      lStack_16a38 = (long)pfVar12;
      ppfStack_16a08 = doc_00;
      do {
        pfStack_16a60 = (fdb_doc *)0x118cab;
        sprintf((char *)__s,"%08d",uVar16 & 0xffffffff);
        *(size_t *)((long)apfStack_16588 + sStack_16a00 + 0x5db8) = afStack_16988[0].keylen;
        uVar15 = (int)lStack_16a38 + (int)uVar16;
        pfStack_16a60 = (fdb_doc *)0x118ce4;
        sprintf(acStack_16688,"meta%d",(ulong)uVar15);
        pfStack_16a60 = (fdb_doc *)0x118cf7;
        sprintf(acStack_16888,"body%d",(ulong)uVar15);
        pfStack_16a60 = (fdb_doc *)0x118d04;
        sVar6 = strlen((char *)asStack_107c8);
        pfStack_16a60 = (fdb_doc *)0x118d10;
        sVar7 = strlen(acStack_16688);
        pfStack_16a60 = (fdb_doc *)0x118d24;
        sVar8 = strlen(acStack_16888);
        lVar1 = lStack_16a38;
        pcVar14 = acStack_16888;
        pfStack_16a60 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_107c8,sVar6 + 1,acStack_16688,sVar7 + 1,pcVar14,sVar8 + 1);
        uVar16 = uVar16 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar16 != 10);
      lVar10 = lStack_16a10 + 1;
      doc_00 = ppfStack_16a08 + 10;
      pfVar12 = (fdb_doc *)(lVar1 + 10);
    } while (lVar10 != 100);
    lVar10 = lStack_16a28 + 1;
    ppfVar11 = ppfStack_16a18 + 1000;
    pfVar12 = (fdb_doc *)(lStack_16a20 + 1000);
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pfStack_16a60 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_16a30,apfStack_16588[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3000);
  pfStack_16a60 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_16a40,'\x01');
  pfStack_16a60 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_16a40,&fStack_169d0);
  if (fStack_169d0.doc_count != 3000) {
    pfStack_16a60 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar10 = 0;
  while( true ) {
    pfStack_16a60 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_16a48,apfStack_16588[lVar10]->key,apfStack_16588[lVar10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_16a60 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_16a30,pfStack_16a48);
    doc = pfStack_16a48;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_16a48->key;
    __s = apfStack_16588[lVar10];
    pcVar14 = (char *)__s->key;
    pfStack_16a60 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar14,pfStack_16a48->keylen);
    pfVar12 = doc;
    if (iVar4 != 0) {
      pfStack_16a60 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar14 = (char *)__s->meta;
    pfStack_16a60 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar14,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar14 = (char *)__s->body;
    pfStack_16a60 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar14,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_16a60 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_16a48 = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3000) {
      pfStack_16a60 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_16a40);
      lVar10 = 0;
      do {
        pfStack_16a60 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_16588[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3000);
      pfStack_16a60 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_16a60 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_16a60 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar14,"long key test");
      return;
    }
  }
  pfStack_16a60 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_16a60 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_16a60 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1af58 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_16a88 = &pfStack_16a48;
  pcStack_16a80 = pcVar14;
  lStack_16a78 = lVar10;
  pfStack_16a70 = pfVar12;
  ppfStack_16a68 = doc_00;
  pfStack_16a60 = __s;
  gettimeofday((timeval *)(auStack_1af10 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1af58 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1af58 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1af58 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1af58 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1ad88.wal_threshold = 0x400;
  fStack_1ad88.compaction_mode = '\0';
  fStack_1ad88.durability_opt = '\x02';
  handle = (char *)&fStack_1aa90;
  ppfVar17 = apfStack_1ac90;
  pcVar14 = "kvs%d";
  uVar16 = 0;
  ppfVar5 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar17,"dummy%d",(ulong)ppfVar5 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1ae90 + (long)ppfVar5 + -10);
    pfStack_1af58 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar17,&fStack_1ad88);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1af38 = ppfVar5;
    pfStack_1af30 = (fdb_kvs_handle *)handle;
    do {
      ppfVar5 = ppfVar2;
      pfStack_1af58 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar17,"kvs%d",(ulong)(uint)((int)ppfVar5 + (int)uVar16));
      pfStack_1af58 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)handle,(char *)ppfVar17,&fStack_1af28);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1af58 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      handle = (char *)&(((fdb_kvs_handle *)handle)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar5 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar5 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar5 = (fdb_kvs_handle **)((long)ppfStack_1af38 + 1);
    uVar16 = uVar16 + 0x80;
    handle = (char *)&pfStack_1af30[1].bub_ctx.space_used;
  } while (ppfVar5 != (fdb_kvs_handle **)0x8);
  ppfVar5 = apfStack_1ae90;
  ppfVar17 = apfStack_1ab90;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar16 = 0;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar5,"key%08d",uVar16);
      pfStack_1af58 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar17,"value%08d",uVar16);
      pcVar14 = *(char **)(&fStack_1aa90.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1af58 = (fdb_kvs_handle *)0x1190e0;
      sVar6 = strlen((char *)ppfVar5);
      ptr_handle = (char *)(sVar6 + 1);
      pfStack_1af58 = (fdb_kvs_handle *)0x1190ec;
      sVar6 = strlen((char *)ppfVar17);
      pfStack_1af58 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar14,ppfVar5,(size_t)ptr_handle,ppfVar17,sVar6 + 1);
      handle = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
    } while (uVar15 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1af58 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1ae90[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1af58 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1ae90[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar17 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_18a90;
  ppfVar5 = (fdb_kvs_handle **)(auStack_1af10 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1af10;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1a690[(long)ppfVar17],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1af10._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1af58 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1af58 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1a690[(long)ppfVar17],
                              (fdb_kvs_handle **)ptr_handle,auStack_1af10._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar17 = ppfVar17 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar17 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1ae90[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1af40;
  pfStack_1af40 = (fdb_kvs_handle *)0x0;
  ppfVar5 = &pfStack_1af48;
  handle = "key%08d";
  ppfVar17 = apfStack_1ae90;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_18a90[(long)pfVar9],(fdb_iterator **)ppfVar5,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar16 = 0;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1af48,(fdb_doc **)ptr_handle);
      pcVar14 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1af58 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar17,"key%08d",uVar16);
      pfStack_1af58 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar17,(char *)pfStack_1af40->op_stats);
      if (iVar4 != 0) {
        pfStack_1af58 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar16 = (ulong)((int)uVar16 + 1);
      pfStack_1af58 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1af48);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1af58 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1af48);
    pcVar14 = (char *)&(pfVar9->config).wal_threshold;
    bVar18 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar14;
  } while (bVar18);
  pfStack_1af58 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1af40);
  ptr_handle = "key%08d";
  ppfVar5 = apfStack_1ae90;
  ppfVar17 = (fdb_kvs_handle **)0x0;
  do {
    uVar16 = 0;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar5,"key%08d",uVar16);
      handle = *(char **)(&fStack_1aa90.kvs_config.create_if_missing + (long)ppfVar17 * 8);
      pfStack_1af58 = (fdb_kvs_handle *)0x1192dd;
      sVar6 = strlen((char *)ppfVar5);
      pfStack_1af58 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)handle,ppfVar5,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
    } while (uVar15 != 10);
    ppfVar17 = (fdb_kvs_handle **)((long)ppfVar17 + 1);
  } while (ppfVar17 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar5 = apfStack_1ac90;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar5,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1af58 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1ae90[(long)((long)&pfVar9[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1af40;
  pfStack_1af40 = (fdb_kvs_handle *)0x0;
  ppfVar5 = &pfStack_1af48;
  handle = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1af58 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1aa90.kvs_config.create_if_missing + (long)handle * 8),
                              (fdb_iterator **)ppfVar5,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)handle;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1af58 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1af48,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1af58 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1af48);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1af58 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1af48);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)handle)->config).wal_threshold;
    bVar18 = handle < (fdb_kvs_handle *)0x380;
    handle = (char *)pfVar9;
  } while (bVar18);
  pfStack_1af58 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1af40);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1af58 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1ae90[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1af58 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1af58 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pfStack_1af58 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar14,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1af58 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1af58 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1af58 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1b2d0 = (code *)0x119494;
  ppfStack_1af70 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1af68 = ppfVar17;
  ppfStack_1af60 = ppfVar5;
  pfStack_1af58 = pfVar9;
  gettimeofday(&tStack_1b280,(__timezone_ptr_t)0x0);
  pcStack_1b2d0 = (code *)0x119499;
  memleak_start();
  pcStack_1b2d0 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar13 = &fStack_1b270;
  pcStack_1b2d0 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1b2d0 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1b2d0 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1b2b0,"./dummy1",pfVar13);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1b2d0 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1b2b0,&pfStack_1b2a8,"db",&fStack_1b298);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1b2d0 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1b2b0,&pfStack_1b2a0,"db2",&fStack_1b298);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar13 = &fStack_1b078;
    pcStack_1b2d0 = (code *)0x119539;
    sprintf((char *)pfVar13,"key%d",0);
    ppfVar5 = apfStack_1b178;
    pcStack_1b2d0 = (code *)0x119554;
    sprintf((char *)ppfVar5,"body%d",0);
    pcStack_1b2d0 = (code *)0x11955c;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar13);
    pcStack_1b2d0 = (code *)0x119567;
    sVar6 = strlen((char *)ppfVar5);
    ppfVar17 = &pfStack_1b2b8;
    pcStack_1b2d0 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar17,pfVar13,(size_t)pfVar9,(void *)0x0,0,ppfVar5,sVar6 + 1);
    pcStack_1b2d0 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1b2a8,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1b2d0 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1b2b0,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1b2d0 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1b2b8->field_6).seqtree,"bOdy%d",0);
    pcStack_1b2d0 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1b2a0,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1b2d0 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1b2b0,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1b2d0 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1b2a8,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1b2d0 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1b2a0,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1b2d0 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1b2a8,(fdb_doc *)pfStack_1b2b8);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1b2d0 = (code *)0x11964d;
      fdb_close(pfStack_1b2b0);
      pcStack_1b2d0 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1b2b8);
      pcStack_1b2d0 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1b2d0 = (code *)0x119661;
      memleak_end();
      pcVar14 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar14 = "%s FAILED\n";
      }
      pcStack_1b2d0 = (code *)0x119692;
      fprintf(_stderr,pcVar14,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1b2d0 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1b2d0 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1b2d0 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1b2d0 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1b2d0 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1b2d0 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1b2d0 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1b2d0 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1b2d0 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1b2d0 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1b2f8 = pfVar13;
  ppfStack_1b2f0 = ppfVar17;
  pfStack_1b2e8 = (fdb_kvs_handle *)pcVar14;
  ppfStack_1b2e0 = ppfVar5;
  pfStack_1b2d8 = pfVar9;
  pcStack_1b2d0 = (code *)uVar16;
  gettimeofday(&tStack_1b708,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1b6f8.wal_threshold = 0x400;
  fStack_1b6f8.flags = 1;
  fStack_1b6f8.purging_interval = 0;
  fStack_1b6f8.compaction_threshold = '\0';
  fStack_1b6f8.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1b6f8.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1b760,"./dummy1",&fStack_1b6f8);
  fdb_kvs_open_default(pfStack_1b760,&pfStack_1b768,&fStack_1b720);
  fVar3 = fdb_set_log_callback(pfStack_1b768,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1b768,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar16 = 0;
    do {
      sprintf(acStack_1b500,"key%d",uVar16);
      sprintf(acStack_1b400,"body%d",uVar16);
      pfVar9 = pfStack_1b768;
      sVar6 = strlen(acStack_1b500);
      sVar7 = strlen(acStack_1b400);
      fVar3 = fdb_set_kv(pfVar9,acStack_1b500,sVar6,acStack_1b400,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar15 = (int)uVar16 + 1;
      uVar16 = (ulong)uVar15;
    } while (uVar15 != 10);
    asStack_1b750[1] = 0x726162ffffffff;
    asStack_1b750[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1b738 = 0xbdbdbdbd;
    uStack_1b734 = 0xbdbdbdbd;
    uStack_1b730 = 0xbdbdbdbd;
    uStack_1b72c = 0xbdbdbdbd;
    uStack_1b728 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1b760,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1b768);
    fdb_close(pfStack_1b760);
    fStack_1b6f8.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1b6f8.encryption_key.bytes,"bar",4);
    fStack_1b6f8.encryption_key.bytes[4] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[5] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[6] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[7] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[8] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[9] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[10] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xb] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xc] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xd] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xe] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0xf] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x10] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x11] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x12] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x13] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x14] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x15] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x16] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x17] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x18] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x19] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1b6f8.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1b760,"./dummy1",&fStack_1b6f8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1b760,&pfStack_1b768,&fStack_1b720);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1b768,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar16 = 0;
      while( true ) {
        sprintf(acStack_1b500,"key%d",uVar16);
        pfVar9 = pfStack_1b768;
        sVar6 = strlen(acStack_1b500);
        fVar3 = fdb_get_kv(pfVar9,acStack_1b500,sVar6,&pvStack_1b758,asStack_1b750);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1b600,"body%d",uVar16);
        ptr = pvStack_1b758;
        iVar4 = bcmp(pvStack_1b758,acStack_1b600,asStack_1b750[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar15 = (int)uVar16 + 1;
        uVar16 = (ulong)uVar15;
        if (uVar15 == 10) {
          fdb_kvs_close(pfStack_1b768);
          fdb_close(pfStack_1b760);
          fdb_shutdown();
          memleak_end();
          pcVar14 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar14 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar14,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
LAB_0011943e:
  pfStack_1af58 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1af58 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1af58 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1af58 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)handle;
LAB_00119452:
  pfStack_1af58 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1af58 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1af58 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1af58 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1af58 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
}

Assistant:

void auto_commit_space_used_test()
{
    TEST_INIT();

    memleak_start();

    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    int ntimes = 4;
    int i;
    char fname[32];

    // remove previous func_test test files
    int r = system(SHELL_DEL" func_test* > errorlog.txt");
    (void)r;

    fconfig = fdb_get_default_config();
    fconfig.buffercache_size= 0;
    fconfig.auto_commit = true;

    fconfig = fdb_get_default_config();
    kvs_config = fdb_get_default_kvs_config();

    for (i = ntimes; i; --i) {
        sprintf(fname, "./func_test1");
        status = fdb_open(&dbfile, fname, &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, "justonekv", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_file_info finfo;
        status = fdb_get_file_info(dbfile, &finfo);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Since V3 magic number, 7 blocks are used:
        // 4 superblocks + KV name header + Stale-tree root node + DB header
        TEST_CHK(finfo.file_size == fconfig.blocksize * 7);

        status = fdb_close(dbfile);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    fdb_shutdown();

    memleak_end();
    TEST_RESULT("auto_commit space used on close test");
}